

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_value *pVal;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  Mem *pMVar6;
  
  pVal = *argv;
  bVar1 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
          [pVal->flags & 0x1f];
  if (1 < bVar1 - 1) {
    if (bVar1 == 3) {
      pcVar3 = (char *)sqlite3ValueText(pVal,'\x01');
      if (pcVar3 == (char *)0x0) {
        return;
      }
      cVar5 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        cVar5 = *pcVar4;
      }
      iVar2 = (int)pcVar4 - (int)pcVar3;
      pMVar6 = context->pOut;
      goto LAB_0019a9ec;
    }
    if (bVar1 != 4) {
      pMVar6 = context->pOut;
      if ((pMVar6->flags & 0x2400) == 0) {
        pMVar6->flags = 1;
        return;
      }
      vdbeMemClearExternAndSetNull(pMVar6);
      return;
    }
  }
  iVar2 = sqlite3ValueBytes(pVal,'\x01');
  pMVar6 = context->pOut;
LAB_0019a9ec:
  if ((pMVar6->flags & 0x2400) == 0) {
    (pMVar6->u).i = (long)iVar2;
    pMVar6->flags = 4;
    return;
  }
  vdbeReleaseAndSetInt64(pMVar6,(long)iVar2);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      const unsigned char *z0;
      unsigned char c;
      if( z==0 ) return;
      z0 = z;
      while( (c = *z)!=0 ){
        z++;
        if( c>=0xc0 ){
          while( (*z & 0xc0)==0x80 ){ z++; z0++; }
        }
      }
      sqlite3_result_int(context, (int)(z-z0));
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}